

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayFirstGroup::init
          (SingleVertexArrayFirstGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  int t;
  InputType type;
  GLValue max_;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  MultiVertexArrayTest *this_00;
  int iVar6;
  long *plVar7;
  ulong *puVar8;
  int **ppiVar9;
  InputType IVar10;
  ulong uVar11;
  int *piVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  long lVar15;
  bool bVar16;
  GLValue GVar17;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  undefined1 local_200 [16];
  pointer local_1f0;
  pointer pAStack_1e8;
  pointer local_1e0;
  long local_1d8;
  SingleVertexArrayFirstGroup *local_1d0;
  long *local_1c8;
  undefined8 local_1c0;
  long local_1b8;
  undefined8 uStack_1b0;
  long *local_1a8;
  undefined8 local_1a0;
  long local_198;
  undefined8 uStack_190;
  long local_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  undefined4 local_13c;
  string local_138;
  string local_118;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined1 local_b8 [16];
  int *local_a8;
  long lStack_a0;
  long local_78;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_1d8 = 0;
  local_1d0 = this;
  do {
    local_188 = 0;
    do {
      local_78 = 0;
      do {
        lVar15 = 0;
        do {
          IVar10 = this->m_type & ~INPUTTYPE_FIXED;
          if (local_78 == 0) {
            iVar2 = 8;
            if (IVar10 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
              iVar2 = deqp::gls::Array::inputTypeSize(this->m_type);
              iVar2 = iVar2 * 2;
            }
          }
          else {
            iVar2 = (&DAT_01c76278)[local_78];
          }
          iVar3 = deqp::gls::Array::inputTypeSize(this->m_type);
          iVar6 = iVar3 * 4;
          if (IVar10 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            iVar6 = iVar3;
          }
          if (iVar2 % iVar6 == 0) {
            uVar14 = (undefined4)
                     CONCAT71((int7)((ulong)this >> 8),
                              *(int *)(&DAT_01c32588 + local_1d8 * 4) % iVar6 == 0);
          }
          else {
            uVar14 = 0;
          }
          iVar6 = *(int *)((long)&DAT_01c0f868 + lVar15);
          typeToString<int>(&local_70,iVar6);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1c127bc);
          local_d8 = &local_c8;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_c8 = *plVar7;
            lStack_c0 = plVar4[3];
          }
          else {
            local_c8 = *plVar7;
            local_d8 = (long *)*plVar4;
          }
          local_d0 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_180 = &local_170;
          puVar8 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar8) {
            local_170 = *puVar8;
            lStack_168 = plVar4[3];
          }
          else {
            local_170 = *puVar8;
            local_180 = (ulong *)*plVar4;
          }
          local_178 = plVar4[1];
          *plVar4 = (long)puVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          iVar3 = *(int *)(&DAT_01c32588 + local_1d8 * 4);
          typeToString<int>(&local_f8,iVar3);
          uVar11 = 0xf;
          if (local_180 != &local_170) {
            uVar11 = local_170;
          }
          if (uVar11 < local_f8._M_string_length + local_178) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              uVar13 = local_f8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_f8._M_string_length + local_178) goto LAB_013c515a;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_180);
          }
          else {
LAB_013c515a:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_180,(ulong)local_f8._M_dataplus._M_p);
          }
          local_1a8 = &local_198;
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_198 = *plVar4;
            uStack_190 = puVar5[3];
          }
          else {
            local_198 = *plVar4;
            local_1a8 = (long *)*puVar5;
          }
          local_1a0 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          local_160 = &local_150;
          puVar8 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar8) {
            local_150 = *puVar8;
            lStack_148 = plVar4[3];
          }
          else {
            local_150 = *puVar8;
            local_160 = (ulong *)*plVar4;
          }
          local_158 = plVar4[1];
          *plVar4 = (long)puVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          typeToString<int>(&local_118,iVar2);
          uVar11 = 0xf;
          if (local_160 != &local_150) {
            uVar11 = local_150;
          }
          if (uVar11 < local_118._M_string_length + local_158) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar13 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_118._M_string_length + local_158) goto LAB_013c52b1;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_160)
            ;
          }
          else {
LAB_013c52b1:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_160,(ulong)local_118._M_dataplus._M_p);
          }
          local_200._0_8_ = &local_1f0;
          ppAVar1 = (pointer *)(puVar5 + 2);
          if ((pointer *)*puVar5 == ppAVar1) {
            local_1f0 = *ppAVar1;
            pAStack_1e8 = (pointer)puVar5[3];
          }
          else {
            local_1f0 = *ppAVar1;
            local_200._0_8_ = (pointer *)*puVar5;
          }
          local_200._8_8_ = puVar5[1];
          *puVar5 = ppAVar1;
          puVar5[1] = 0;
          *(undefined1 *)ppAVar1 = 0;
          plVar4 = (long *)std::__cxx11::string::append(local_200);
          local_b8._0_8_ = &local_a8;
          ppiVar9 = (int **)(plVar4 + 2);
          if ((int **)*plVar4 == ppiVar9) {
            local_a8 = *ppiVar9;
            lStack_a0 = plVar4[3];
          }
          else {
            local_a8 = *ppiVar9;
            local_b8._0_8_ = (int **)*plVar4;
          }
          local_b8._8_8_ = plVar4[1];
          *plVar4 = (long)ppiVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          t = *(int *)(&DAT_01c0f860 + local_188 * 4);
          local_13c = uVar14;
          typeToString<int>(&local_138,t);
          piVar12 = (int *)0xf;
          if ((int **)local_b8._0_8_ != &local_a8) {
            piVar12 = local_a8;
          }
          if (piVar12 < (int *)(local_138._M_string_length + local_b8._8_8_)) {
            uVar13 = (int *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              uVar13 = local_138.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < (int *)(local_138._M_string_length + local_b8._8_8_))
            goto LAB_013c5411;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,local_b8._0_8_);
          }
          else {
LAB_013c5411:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_b8,(ulong)local_138._M_dataplus._M_p);
          }
          local_1c8 = &local_1b8;
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_1b8 = *plVar4;
            uStack_1b0 = puVar5[3];
          }
          else {
            local_1b8 = *plVar4;
            local_1c8 = (long *)*puVar5;
          }
          local_1c0 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((int **)local_b8._0_8_ != &local_a8) {
            operator_delete((void *)local_b8._0_8_,(long)local_a8 + 1);
          }
          if ((pointer *)local_200._0_8_ != &local_1f0) {
            operator_delete((void *)local_200._0_8_,(ulong)((long)&local_1f0->inputType + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if (local_160 != &local_150) {
            operator_delete(local_160,local_150 + 1);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180,local_170 + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          type = local_1d0->m_type;
          GVar17 = deqp::gls::GLValue::getMinValue(type);
          aStack_38 = GVar17.field_1;
          local_40 = GVar17.type;
          GVar17 = deqp::gls::GLValue::getMaxValue(local_1d0->m_type);
          aStack_48 = GVar17.field_1;
          local_50 = GVar17.type;
          max_._4_4_ = uStack_4c;
          max_.type = local_50;
          GVar17._4_4_ = uStack_3c;
          GVar17.type = local_40;
          GVar17.field_1 = aStack_38;
          max_.field_1 = aStack_48;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    ((ArraySpec *)local_b8,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                     (uint)(IVar10 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) * 2 + 2,iVar3,iVar2,false,
                     GVar17,max_);
          local_1f0 = (pointer)0x0;
          pAStack_1e8 = (pointer)0x0;
          local_1e0 = (pointer)0x0;
          local_200._4_4_ = t;
          local_200._0_4_ = PRIMITIVE_TRIANGLES;
          local_200._8_4_ = iVar6;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_1f0,(iterator)0x0,(ArraySpec *)local_b8);
          this = local_1d0;
          if ((char)local_13c == '\0') {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                               m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                       (Spec *)local_200,(char *)local_1c8,(char *)local_1c8);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          if (local_1f0 != (pointer)0x0) {
            operator_delete(local_1f0,(long)local_1e0 - (long)local_1f0);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8,local_1b8 + 1);
          }
          lVar15 = lVar15 + 4;
        } while (lVar15 == 4);
        local_78 = local_78 + 1;
      } while (local_78 != 3);
      bVar16 = local_188 == 0;
      local_188 = local_188 + 1;
    } while (bVar16);
    lVar15 = local_1d8 + 1;
    bVar16 = local_1d8 != 0;
    local_1d8 = lVar15;
    if (bVar16) {
      return (int)lVar15;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayFirstGroup::init (void)
{
	int					counts[]		= {5, 256};
	int					firsts[]		= {6, 24};
	int					offsets[]		= {1, 17};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); firstNdx++)
				{
					const bool	packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
					const int	componentCount	= (packed) ? (4) : (2);
					const int	stride			= (strides[strideNdx] < 0) ? ((packed) ? (8) : (Array::inputTypeSize(m_type) * componentCount)) : (strides[strideNdx]);
					const int	alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
					const bool	aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
					std::string name			= "first" + typeToString(firsts[firstNdx]) + "_offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	offsets[offsetNdx],
																	stride,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= firsts[firstNdx];
					spec.arrays.push_back(arraySpec);

					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}